

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

Cba_Ntk_t * Cba_NtkDup(Cba_Man_t *pMan,Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  Cba_Ntk_t *pCVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_50;
  int local_4c;
  int nFons;
  int nFins;
  int nPos;
  int nPis;
  int iFon;
  int iFin;
  int iObjNew;
  int iObj;
  int k;
  int i;
  Cba_Ntk_t *pNew;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  Cba_Man_t *pMan_local;
  
  pNew = (Cba_Ntk_t *)vObjs;
  vObjs_local = (Vec_Int_t *)p;
  p_local = (Cba_Ntk_t *)pMan;
  Cba_NtkCountParams(p,vObjs,&nFins,&nFons,&local_4c,&local_50);
  pCVar1 = p_local;
  iVar3 = Cba_NtkNameId((Cba_Ntk_t *)vObjs_local);
  iVar4 = Vec_IntSize((Vec_Int_t *)pNew);
  _k = Cba_NtkAlloc((Cba_Man_t *)pCVar1,iVar3,nFins,nFons,iVar4,local_4c,local_50);
  Cba_NtkCleanObjCopies((Cba_Ntk_t *)vObjs_local);
  Cba_NtkCleanFonCopies((Cba_Ntk_t *)vObjs_local);
  for (iObj = 0; iVar3 = iObj, iVar4 = Vec_IntSize((Vec_Int_t *)pNew), iVar3 < iVar4;
      iObj = iObj + 1) {
    iFin = Vec_IntEntry((Vec_Int_t *)pNew,iObj);
    iFon = Cba_ObjDup(_k,(Cba_Ntk_t *)vObjs_local,iFin);
    iObjNew = 0;
    for (nPos = Cba_ObjFon0((Cba_Ntk_t *)vObjs_local,iFin); iVar3 = nPos,
        iVar5 = Cba_ObjFon0((Cba_Ntk_t *)vObjs_local,iFin + 1), pVVar2 = vObjs_local, iVar4 = nPos,
        iVar3 < iVar5; nPos = nPos + 1) {
      iVar3 = Cba_ObjFon(_k,iFon,iObjNew);
      Cba_FonSetCopy((Cba_Ntk_t *)pVVar2,iVar4,iVar3);
      iObjNew = iObjNew + 1;
    }
  }
  for (iObj = 0; iVar3 = iObj, iVar4 = Vec_IntSize((Vec_Int_t *)pNew), iVar3 < iVar4;
      iObj = iObj + 1) {
    iFin = Vec_IntEntry((Vec_Int_t *)pNew,iObj);
    iFon = Cba_ObjCopy((Cba_Ntk_t *)vObjs_local,iFin);
    iObjNew = 0;
    for (nPis = Cba_ObjFin0((Cba_Ntk_t *)vObjs_local,iFin); iVar3 = nPis,
        iVar4 = Cba_ObjFin0((Cba_Ntk_t *)vObjs_local,iFin + 1), iVar3 < iVar4; nPis = nPis + 1) {
      nPos = Cba_FinFon((Cba_Ntk_t *)vObjs_local,nPis);
      pCVar1 = _k;
      iVar4 = iObjNew;
      iVar3 = iFon;
      iVar5 = Cba_FonCopy((Cba_Ntk_t *)vObjs_local,nPos);
      Cba_ObjSetFinFon(pCVar1,iVar3,iVar4,iVar5);
      iObjNew = iObjNew + 1;
    }
  }
  iVar3 = Cba_NtkObjNum(_k);
  iVar4 = Cba_NtkObjNumAlloc(_k);
  pVVar2 = vObjs_local;
  if (iVar3 != iVar4) {
    __assert_fail("Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                  ,0x2c0,"Cba_Ntk_t *Cba_NtkDup(Cba_Man_t *, Cba_Ntk_t *, Vec_Int_t *)");
  }
  iVar3 = Cba_NtkId(_k);
  Cba_NtkSetCopy((Cba_Ntk_t *)pVVar2,iVar3);
  return _k;
}

Assistant:

static inline Cba_Ntk_t * Cba_NtkDup( Cba_Man_t * pMan, Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Cba_Ntk_t * pNew;
    int i, k, iObj, iObjNew, iFin, iFon;
    int nPis, nPos, nFins, nFons;
    Cba_NtkCountParams( p, vObjs, &nPis, &nPos, &nFins, &nFons );
    pNew = Cba_NtkAlloc( pMan, Cba_NtkNameId(p), nPis, nPos, Vec_IntSize(vObjs), nFins, nFons );
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjDup( pNew, p, iObj );
        Cba_ObjForEachFon( p, iObj, iFon, k )
            Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, k) );
    }
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjCopy( p, iObj );
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( pNew, iObjNew, k, Cba_FonCopy(p, iFon) );
    }
    //Cba_NtkFreeObjCopies( p );
    //Cba_NtkFreeFonCopies( p );
    assert( Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew) );
    Cba_NtkSetCopy( p, Cba_NtkId(pNew) );
    return pNew;
}